

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

char * __thiscall
cppcms::impl::url_rewriter::rewrite(url_rewriter *this,char *url,string_pool *pool)

{
  pointer prVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  cmatch m;
  
  m.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  m.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m.begin_ = (char *)0x0;
  m.end_ = (char *)0x0;
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    prVar1 = (this->rules_).
             super__Vector_base<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->rules_).
                       super__Vector_base<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)prVar1) / 0x48) <= uVar4)
    break;
    bVar2 = booster::regex_match<booster::regex>(url,&m,&prVar1->expression + lVar3,0);
    if (bVar2) {
      url = rule::rewrite_once((rule *)(&prVar1->expression + lVar3),&m,pool);
      if ((&prVar1->final)[lVar3] != false) break;
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x48;
  }
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&m.offsets_.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  return url;
}

Assistant:

char *rewrite(char *url,string_pool &pool) const
	{
		booster::cmatch m;
		for(size_t i=0;i<rules_.size();i++) {
			rule const &r = rules_[i];
			if(booster::regex_match(url,m,r.expression)) {
				url = r.rewrite_once(m,pool);
				if(r.final)
					break;
			}
		}
		return url;
	}